

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void destroy_ship_proc(Am_Object *command_obj,Am_Object *param_2,Am_Inter_Location *data)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  bool bVar4;
  Am_Object local_80;
  uint local_74;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object source_ship;
  Am_Object inter;
  Am_Object obj_over;
  undefined1 local_39;
  uint local_38;
  int iStack_34;
  bool flag;
  int y2;
  int x2;
  int y1;
  int x1;
  Am_Object ref_obj;
  Am_Inter_Location *data_local;
  Am_Object *param_1_local;
  Am_Object *command_obj_local;
  
  ref_obj.data = (Am_Object_Data *)data;
  Am_Object::Am_Object((Am_Object *)&y1);
  Am_Inter_Location::Get_Location
            ((bool *)data,(Am_Object *)&local_39,&y1,&x2,&y2,&stack0xffffffffffffffcc);
  bVar1 = Am_Object::operator!=((Am_Object *)&y1,(Am_Object *)&SP_Ship_Agg);
  if ((bVar1 & 1) != 0) {
    Am_Translate_Coordinates
              ((Am_Object *)&y1,iStack_34,local_38,(Am_Object *)&SP_Ship_Agg,
               &stack0xffffffffffffffcc,(int *)&local_38);
  }
  Am_Point_In_Part((Am_Object *)&inter,0x1133f0,iStack_34,(Am_Object *)(ulong)local_38,true,false);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::Get_Owner(&source_ship,(Am_Slot_Flags)command_obj);
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&source_ship,0x11a);
    Am_Object::Am_Object(&local_68,pAVar2);
    bVar1 = Am_Object::operator!=(&inter,(Am_Object *)&local_68);
    bVar4 = (bVar1 & 1) != 0;
    if (bVar4) {
      Am_Object::Am_Object(&local_70,(Am_Object *)&inter);
      hide_ship(&local_70);
      Am_Object::~Am_Object(&local_70);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
      Am_Object::Set((ushort)command_obj,(Am_Wrapper *)0x169,(ulong)pAVar3);
    }
    local_74 = (uint)bVar4;
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&source_ship);
    if (local_74 != 0) goto LAB_001087c8;
  }
  Am_Object::Am_Object(&local_80,(Am_Object *)command_obj);
  Am_Abort_Widget((Am_Object *)&local_80);
  Am_Object::~Am_Object(&local_80);
  local_74 = 0;
LAB_001087c8:
  Am_Object::~Am_Object(&inter);
  Am_Object::~Am_Object((Am_Object *)&y1);
  return;
}

Assistant:

Am_Define_Method(Am_Current_Location_Method, void, destroy_ship,
                 (Am_Object command_obj, Am_Object /* obj_modified */,
                  Am_Inter_Location data))
{
  // We use the second endpoint of the phaser beam to determine the location
  // of the ship to destroy.
  Am_Object ref_obj;
  int x1, y1, x2, y2;
  bool flag;
  // the phaser is from (x1, y1) to (x2, y2) wrt ref_obj.
  data.Get_Location(flag, ref_obj, x1, y1, x2, y2);
  if (ref_obj != SP_Ship_Agg)
    Am_Translate_Coordinates(ref_obj, x2, y2, SP_Ship_Agg, x2, y2);

  Am_Object obj_over = Am_Point_In_Part(SP_Ship_Agg, x2, y2, SP_Ship_Agg);
  if (obj_over.Valid()) {
    // Don't allow a ship to destroy itself.
    // get object the interactor started over, which will be the source ship
    Am_Object inter = command_obj.Get_Owner();
    Am_Object source_ship = inter.Get(Am_START_OBJECT);
    if (obj_over != source_ship) {
      // destroy_tractor_beams (obj_over);
      // obj_over.Destroy();
      hide_ship(obj_over);
      command_obj.Set(Am_VALUE, obj_over);
      return; //everything is fine
    }
  }
  // if get here, then nothing destroyed
  Am_Abort_Widget(command_obj); //make this not be queued for undo
}